

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

fio_url_s * fio_url_parse(fio_url_s *__return_storage_ptr__,char *url,size_t length)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *pbVar6;
  size_t sVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  byte *pbVar12;
  byte *pbVar13;
  bool bVar14;
  
  memset(__return_storage_ptr__,0,0xc0);
  (__return_storage_ptr__->scheme).data = url;
  bVar14 = true;
  if (length != 0) {
    pbVar2 = (byte *)(url + length);
    bVar3 = *url;
    if (bVar3 == 0x2f) {
      pbVar5 = (byte *)0x0;
      pbVar6 = (byte *)0x0;
      pbVar12 = (byte *)0x0;
      sVar4 = 0;
LAB_0010b4b0:
      pbVar8 = (byte *)url;
      if (url < pbVar2) {
        sVar7 = 0;
        do {
          if ((((byte *)url)[sVar7] == 0x23) || (((byte *)url)[sVar7] == 0x3f)) {
            (__return_storage_ptr__->path).capa = 0;
            (__return_storage_ptr__->path).len = sVar7;
            (__return_storage_ptr__->path).data = url;
            pbVar13 = (byte *)url + sVar7 + 1;
            pbVar8 = pbVar13;
            if (((byte *)url)[sVar7] != 0x23) goto joined_r0x0010b715;
            sVar11 = 0;
            goto LAB_0010b77c;
          }
          lVar9 = sVar7 + 1;
          sVar7 = sVar7 + 1;
        } while ((byte *)url + lVar9 < pbVar2);
        pbVar8 = (byte *)url + sVar7;
      }
      sVar7 = (long)pbVar8 - (long)url;
      (__return_storage_ptr__->path).capa = 0;
      (__return_storage_ptr__->path).len = sVar7;
      (__return_storage_ptr__->path).data = url;
      bVar14 = true;
      sVar11 = 0;
      goto LAB_0010b823;
    }
    pbVar8 = (byte *)url;
    if (0 < (long)length) {
      pbVar8 = (byte *)(url + 1);
      while ((0x1d < bVar3 - 0x23 || ((0x30801001U >> (bVar3 - 0x23 & 0x1f) & 1) == 0))) {
        if (pbVar2 <= pbVar8) goto LAB_0010b538;
        bVar3 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      }
      pbVar8 = pbVar8 + -1;
    }
LAB_0010b538:
    if (pbVar8 == pbVar2) {
      (__return_storage_ptr__->host).len = length;
      (__return_storage_ptr__->host).data = url;
      goto LAB_0010b623;
    }
    bVar3 = *pbVar8;
    sVar4 = 0;
    pbVar13 = pbVar8;
    if (bVar3 < 0x3a) {
      if (bVar3 == 0x23) {
        (__return_storage_ptr__->host).len = (long)pbVar8 - (long)url;
        (__return_storage_ptr__->host).data = url;
        pbVar13 = pbVar8 + 1;
        sVar11 = 0;
        sVar7 = 0;
        pbVar5 = (byte *)0x0;
        pbVar6 = (byte *)0x0;
        pbVar12 = (byte *)0x0;
        sVar4 = 0;
LAB_0010b77c:
        (__return_storage_ptr__->target).capa = 0;
        bVar14 = (long)pbVar2 - (long)pbVar13 == 0;
        (__return_storage_ptr__->target).len = (long)pbVar2 - (long)pbVar13;
        (__return_storage_ptr__->target).data = (char *)pbVar13;
        goto LAB_0010b823;
      }
      if (bVar3 == 0x2f) {
        (__return_storage_ptr__->host).len = (long)pbVar8 - (long)url;
        (__return_storage_ptr__->host).data = url;
        pbVar5 = (byte *)0x0;
        pbVar6 = (byte *)0x0;
        pbVar12 = (byte *)0x0;
        sVar4 = 0;
        url = (char *)pbVar8;
        goto LAB_0010b4b0;
      }
LAB_0010b68d:
      pbVar5 = pbVar13;
      if (pbVar13 < pbVar2) {
        pbVar5 = (byte *)0x0;
        do {
          bVar3 = pbVar13[(long)pbVar5];
          if (bVar3 == 0x2f) {
            (__return_storage_ptr__->host).capa = 0;
            (__return_storage_ptr__->host).len = (size_t)pbVar5;
            (__return_storage_ptr__->host).data = (char *)pbVar13;
            url = (char *)(pbVar13 + (long)pbVar5);
            pbVar5 = (byte *)0x0;
            goto LAB_0010b939;
          }
          pbVar12 = pbVar5;
          if (bVar3 == 0x3a) {
            (__return_storage_ptr__->user).capa = 0;
            pbVar8 = pbVar13 + (long)pbVar5;
            url = (char *)pbVar13;
            goto LAB_0010b7a9;
          }
          if (bVar3 == 0x40) {
            (__return_storage_ptr__->user).capa = 0;
            pbVar8 = pbVar13 + (long)pbVar5;
            lVar9 = 0x28;
            lVar10 = 0x20;
            pbVar6 = (byte *)0x0;
            goto LAB_0010b583;
          }
          pbVar6 = pbVar5 + 1;
          pbVar5 = pbVar5 + 1;
        } while (pbVar13 + (long)pbVar6 < pbVar2);
        pbVar5 = pbVar13 + (long)pbVar5;
      }
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)pbVar5 - (long)pbVar13;
      (__return_storage_ptr__->host).data = (char *)pbVar13;
      pbVar5 = (byte *)0x0;
      goto LAB_0010b81e;
    }
    if (bVar3 == 0x3a) {
      if (((pbVar2 < pbVar8 + 2) || (pbVar8[1] != 0x2f)) || (pbVar8[2] != 0x2f)) {
        pbVar12 = pbVar8 + -(long)url;
        sVar4 = 0;
LAB_0010b7a9:
        (__return_storage_ptr__->user).len = (size_t)pbVar12;
        (__return_storage_ptr__->user).data = url;
        pbVar13 = pbVar8 + 1;
        pbVar5 = pbVar13;
        if (pbVar13 < pbVar2) {
          pbVar5 = (byte *)0x0;
LAB_0010b7c1:
          if (pbVar13[(long)pbVar5] == 0x2f) {
            (__return_storage_ptr__->port).capa = 0;
            (__return_storage_ptr__->port).len = (size_t)pbVar5;
            (__return_storage_ptr__->port).data = (char *)pbVar13;
            sVar7 = (__return_storage_ptr__->user).len;
            (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
            (__return_storage_ptr__->host).len = sVar7;
            (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
            (__return_storage_ptr__->user).len = 0;
            url = (char *)(pbVar13 + (long)pbVar5);
LAB_0010b939:
            pbVar6 = (byte *)0x0;
            pbVar12 = (byte *)0x0;
            goto LAB_0010b4b0;
          }
          if (pbVar13[(long)pbVar5] != 0x40) goto code_r0x0010b7d8;
          (__return_storage_ptr__->password).capa = 0;
          pbVar8 = pbVar13 + (long)pbVar5;
          lVar9 = 0x40;
          lVar10 = 0x38;
          pbVar6 = pbVar5;
          goto LAB_0010b583;
        }
        goto LAB_0010b7ea;
      }
      sVar4 = (long)pbVar8 - (long)url;
      (__return_storage_ptr__->scheme).len = sVar4;
      pbVar13 = pbVar8 + 3;
      goto LAB_0010b68d;
    }
    if (bVar3 == 0x3f) {
      (__return_storage_ptr__->host).len = (long)pbVar8 - (long)url;
      (__return_storage_ptr__->host).data = url;
      pbVar13 = pbVar8 + 1;
      sVar7 = 0;
      pbVar5 = (byte *)0x0;
      pbVar6 = (byte *)0x0;
      pbVar12 = (byte *)0x0;
      sVar4 = 0;
      pbVar8 = pbVar13;
joined_r0x0010b715:
      for (; (pbVar13 < pbVar2 && (*pbVar13 != 0x23)); pbVar13 = pbVar13 + 1) {
      }
      sVar11 = (long)pbVar13 - (long)pbVar8;
      (__return_storage_ptr__->query).capa = 0;
      (__return_storage_ptr__->query).len = sVar11;
      (__return_storage_ptr__->query).data = (char *)pbVar8;
      pbVar13 = pbVar13 + 1;
      bVar14 = true;
      if (pbVar13 < pbVar2) goto LAB_0010b77c;
    }
    else {
      if (bVar3 != 0x40) goto LAB_0010b68d;
      pbVar5 = pbVar8 + -(long)url;
      lVar9 = 0x28;
      lVar10 = 0x20;
      sVar4 = 0;
      pbVar6 = (byte *)0x0;
      pbVar12 = pbVar5;
      pbVar13 = (byte *)url;
LAB_0010b583:
      *(byte **)((long)&(__return_storage_ptr__->scheme).capa + lVar10) = pbVar5;
      *(byte **)((long)&(__return_storage_ptr__->scheme).capa + lVar9) = pbVar13;
      pbVar5 = pbVar8 + 1;
      pbVar13 = pbVar5;
      if (pbVar5 < pbVar2) {
        sVar7 = 0;
        do {
          if (((ulong)*pbVar13 < 0x40) &&
             ((0x8400800800000000U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)) {
            (__return_storage_ptr__->host).capa = 0;
            (__return_storage_ptr__->host).len = sVar7;
            (__return_storage_ptr__->host).data = (char *)pbVar5;
            bVar3 = *pbVar13;
            if (bVar3 == 0x23) {
              pbVar13 = pbVar13 + 1;
              sVar11 = 0;
              sVar7 = 0;
              pbVar5 = (byte *)0x0;
              goto LAB_0010b77c;
            }
            if (bVar3 == 0x3f) {
              pbVar13 = pbVar13 + 1;
              sVar7 = 0;
              pbVar5 = (byte *)0x0;
              pbVar8 = pbVar13;
              goto joined_r0x0010b715;
            }
            if (bVar3 == 0x2f) {
              pbVar5 = (byte *)0x0;
              url = (char *)pbVar13;
              goto LAB_0010b4b0;
            }
            pbVar1 = pbVar13 + 1;
            url = (char *)pbVar1;
            if (pbVar2 <= pbVar1) goto LAB_0010b9d1;
            pbVar13 = pbVar13 + 2;
            pbVar5 = (byte *)0x0;
            goto LAB_0010b9b3;
          }
          pbVar13 = pbVar13 + 1;
          sVar7 = sVar7 + 1;
        } while (pbVar13 < pbVar2);
      }
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)pbVar13 - (long)pbVar5;
      (__return_storage_ptr__->host).data = (char *)pbVar5;
      bVar14 = true;
      sVar11 = 0;
      sVar7 = 0;
      pbVar5 = (byte *)0x0;
    }
    goto LAB_0010b823;
  }
LAB_0010b623:
  pbVar12 = (byte *)0x0;
  pbVar6 = (byte *)0x0;
  pbVar5 = (byte *)0x0;
  sVar7 = 0;
  sVar11 = 0;
  goto LAB_0010b828;
code_r0x0010b7d8:
  pbVar6 = pbVar5 + 1;
  pbVar5 = pbVar5 + 1;
  if (pbVar2 <= pbVar13 + (long)pbVar6) goto code_r0x0010b7e7;
  goto LAB_0010b7c1;
  while( true ) {
    url = (char *)((byte *)url + 1);
    pbVar5 = pbVar5 + 1;
    pbVar13 = pbVar13 + 1;
    if (pbVar2 <= url) break;
LAB_0010b9b3:
    if (((ulong)(byte)*url < 0x40) && ((0x8000800800000000U >> ((ulong)(byte)*url & 0x3f) & 1) != 0)
       ) {
      (__return_storage_ptr__->port).capa = 0;
      (__return_storage_ptr__->port).len = (size_t)pbVar5;
      (__return_storage_ptr__->port).data = (char *)pbVar1;
      if (*url == 0x23) {
        sVar11 = 0;
        sVar7 = 0;
        goto LAB_0010b77c;
      }
      if (*url != 0x3f) goto LAB_0010b4b0;
      sVar7 = 0;
      pbVar8 = pbVar13;
      goto joined_r0x0010b715;
    }
  }
LAB_0010b9d1:
  pbVar5 = (byte *)url + (-sVar7 - (long)pbVar8) + -2;
  (__return_storage_ptr__->port).capa = 0;
  (__return_storage_ptr__->port).len = (size_t)pbVar5;
  (__return_storage_ptr__->port).data = (char *)pbVar1;
  bVar14 = true;
  sVar11 = 0;
  sVar7 = 0;
  goto LAB_0010b823;
code_r0x0010b7e7:
  pbVar5 = pbVar13 + (long)pbVar5;
LAB_0010b7ea:
  pbVar5 = pbVar5 + -(long)pbVar13;
  (__return_storage_ptr__->port).capa = 0;
  (__return_storage_ptr__->port).len = (size_t)pbVar5;
  (__return_storage_ptr__->port).data = (char *)pbVar13;
  (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
  (__return_storage_ptr__->host).len = (__return_storage_ptr__->user).len;
  (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
  (__return_storage_ptr__->user).len = 0;
LAB_0010b81e:
  sVar11 = 0;
  sVar7 = 0;
  bVar14 = true;
  pbVar6 = (byte *)0x0;
  pbVar12 = (byte *)0x0;
LAB_0010b823:
  if (sVar4 != 0) goto LAB_0010b830;
LAB_0010b828:
  (__return_storage_ptr__->scheme).data = (char *)0x0;
LAB_0010b830:
  if (pbVar12 == (byte *)0x0) {
    (__return_storage_ptr__->user).data = (char *)0x0;
  }
  if (pbVar6 == (byte *)0x0) {
    (__return_storage_ptr__->password).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->host).len == 0) {
    (__return_storage_ptr__->host).data = (char *)0x0;
  }
  if (pbVar5 == (byte *)0x0) {
    (__return_storage_ptr__->port).data = (char *)0x0;
  }
  if (sVar7 == 0) {
    (__return_storage_ptr__->path).data = (char *)0x0;
  }
  if (sVar11 == 0) {
    (__return_storage_ptr__->query).data = (char *)0x0;
  }
  if (bVar14) {
    (__return_storage_ptr__->target).data = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

fio_url_s fio_url_parse(const char *url, size_t length) {
  /*
  Intention:
  [schema://][user[:]][password[@]][host.com[:/]][:port/][/path][?quary][#target]
  */
  const char *end = url + length;
  const char *pos = url;
  fio_url_s r = {.scheme = {.data = (char *)url}};
  if (length == 0) {
    goto finish;
  }

  if (pos[0] == '/') {
    /* start at path */
    goto start_path;
  }

  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@' &&
         pos[0] != '#' && pos[0] != '?')
    ++pos;

  if (pos == end) {
    /* was only host (path starts with '/') */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }
  switch (pos[0]) {
  case '@':
    /* username@[host] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case '/':
    /* host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '?':
    /* host?[query] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_query;
  case '#':
    /* host#[target] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_target;
  case ':':
    if (pos + 2 <= end && pos[1] == '/' && pos[2] == '/') {
      /* scheme:// */
      r.scheme.len = pos - url;
      pos += 3;
    } else {
      /* username:[password] OR */
      /* host:[port] */
      r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
      ++pos;
      goto start_password;
    }
    break;
  }

  // start_username:
  url = pos;
  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@'
         /* && pos[0] != '#' && pos[0] != '?' */)
    ++pos;

  if (pos >= end) { /* scheme://host */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }

  switch (pos[0]) {
  case '/':
    /* scheme://host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '@':
    /* scheme://username@[host]... */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case ':':
    /* scheme://username:[password]@[host]... OR */
    /* scheme://host:[port][/...] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_password:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '@')
    ++pos;

  if (pos >= end) {
    /* was host:port */
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto finish;
    ;
  }

  switch (pos[0]) {
  case '/':
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto start_path;
  case '@':
    r.password = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_host:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != ':' && pos[0] != '#' &&
         pos[0] != '?')
    ++pos;

  r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  if (pos >= end) {
    goto finish;
  }
  switch (pos[0]) {
  case '/':
    /* scheme://[...@]host[/path] */
    goto start_path;
  case '?':
    /* scheme://[...@]host?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host#[target] (bad)*/
    ++pos;
    goto start_target;
    // case ':':
    /* scheme://[...@]host:[port] */
  }
  ++pos;

  // start_port:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    /* scheme://[...@]host:port */
    goto finish;
  }
  switch (pos[0]) {
  case '?':
    /* scheme://[...@]host:port?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host:port#[target] (bad)*/
    ++pos;
    goto start_target;
    // case '/':
    /* scheme://[...@]host:port[/path] */
  }

start_path:
  url = pos;
  while (pos < end && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.path = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    goto finish;
  }
  ++pos;
  if (pos[-1] == '#')
    goto start_target;

start_query:
  url = pos;
  while (pos < end && pos[0] != '#')
    ++pos;

  r.query = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  ++pos;

  if (pos >= end)
    goto finish;

start_target:
  r.target = (fio_str_info_s){.data = (char *)pos, .len = end - pos};

finish:

  /* set any empty values to NULL */
  if (!r.scheme.len)
    r.scheme.data = NULL;
  if (!r.user.len)
    r.user.data = NULL;
  if (!r.password.len)
    r.password.data = NULL;
  if (!r.host.len)
    r.host.data = NULL;
  if (!r.port.len)
    r.port.data = NULL;
  if (!r.path.len)
    r.path.data = NULL;
  if (!r.query.len)
    r.query.data = NULL;
  if (!r.target.len)
    r.target.data = NULL;

  return r;
}